

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

void __thiscall tinyxml2::XMLDocument::MarkInUse(XMLDocument *this,XMLNode *node)

{
  uint uVar1;
  XMLNode **ppXVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = (this->_unlinked)._size;
  ppXVar2 = (this->_unlinked)._mem;
  uVar5 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  do {
    uVar4 = uVar3;
    if (uVar5 == uVar4) {
      return;
    }
    uVar3 = uVar4 + 1;
  } while (ppXVar2[uVar4] != node);
  ppXVar2[uVar4] = ppXVar2[(long)(int)uVar1 + -1];
  (this->_unlinked)._size = uVar1 - 1;
  return;
}

Assistant:

void XMLDocument::MarkInUse(XMLNode* node)
{
	TIXMLASSERT(node);
	TIXMLASSERT(node->_parent == 0);

	for (int i = 0; i < _unlinked.Size(); ++i) {
		if (node == _unlinked[i]) {
			_unlinked.SwapRemove(i);
			break;
		}
	}
}